

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.hpp
# Opt level: O0

any __thiscall cs_impl::fiber::Channel<cs_impl::any>::pop(Channel<cs_impl::any> *this)

{
  bool bVar1;
  routine_t rVar2;
  list<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RSI;
  proxy *in_RDI;
  any obj;
  any *in_stack_ffffffffffffffc8;
  proxy *this_00;
  
  this_00 = in_RDI;
  if (*(int *)&in_RSI[1].super__List_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
               _M_node.super__List_node_base._M_next == 0) {
    rVar2 = current();
    *(routine_t *)
     &in_RSI[1].super__List_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl._M_node.
      super__List_node_base._M_next = rVar2;
  }
  while (bVar1 = std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>::empty(in_RSI),
        bVar1) {
    yield();
  }
  std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>::front
            ((list<cs_impl::any,_std::allocator<cs_impl::any>_> *)this_00);
  any::any((any *)this_00,in_stack_ffffffffffffffc8);
  std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>::pop_front
            ((list<cs_impl::any,_std::allocator<cs_impl::any>_> *)this_00);
  any::any((any *)this_00,in_stack_ffffffffffffffc8);
  any::~any((any *)0x25b2dd);
  return (any)in_RDI;
}

Assistant:

inline Type pop()
			{
				if (!_taker)
					_taker = current();

				while (_list.empty())
					yield();

				Type obj = std::move(_list.front());
				_list.pop_front();
				return std::move(obj);
			}